

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeTabBar(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ImGuiTabItem *tab_00;
  char *pcVar5;
  char *local_170;
  char local_155;
  ImGuiTabItem *tab;
  int tab_n;
  char *buf_end;
  char *p;
  char buf [256];
  ImGuiTabBar *tab_bar_local;
  
  uVar1 = (tab_bar->Tabs).Size;
  iVar2 = tab_bar->PrevFrameVisible;
  iVar4 = GetFrameCount();
  pcVar5 = "";
  if (iVar2 < iVar4 + -2) {
    pcVar5 = " *Inactive*";
  }
  ImFormatString((char *)&p,(size_t)(buf + (0xf8 - (long)&p)),"TabBar (%d tabs)%s",(ulong)uVar1,
                 pcVar5);
  bVar3 = TreeNode(tab_bar,"%s",&p);
  if (bVar3) {
    for (tab._4_4_ = 0; (int)tab._4_4_ < (tab_bar->Tabs).Size; tab._4_4_ = tab._4_4_ + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
      PushID(tab_00);
      bVar3 = SmallButton("<");
      if (bVar3) {
        TabBarQueueChangeTabOrder(tab_bar,tab_00,-1);
      }
      SameLine(0.0,2.0);
      bVar3 = SmallButton(">");
      if (bVar3) {
        TabBarQueueChangeTabOrder(tab_bar,tab_00,1);
      }
      SameLine(0.0,-1.0);
      local_155 = '*';
      if (tab_00->ID != tab_bar->SelectedTabId) {
        local_155 = ' ';
      }
      uVar1 = tab_00->ID;
      if (tab_00->NameOffset == -1) {
        local_170 = "";
      }
      else {
        local_170 = ImGuiTabBar::GetTabName(tab_bar,tab_00);
      }
      Text("%02d%c Tab 0x%08X \'%s\'",(ulong)tab._4_4_,(ulong)(uint)(int)local_155,(ulong)uVar1,
           local_170);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s'", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "");
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }